

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase520::run(TestCase520 *this)

{
  PointerType PVar1;
  Reader reader;
  Builder root;
  MallocMessageBuilder builder;
  uint local_a1c;
  StructBuilder local_a18;
  ListElementCount local_9f0;
  ListReader local_9e8;
  ListBuilder local_9b8;
  PointerBuilder local_990;
  ListElementCount local_974;
  ListReader local_970;
  ListReader local_940;
  ListReader local_910;
  ListReader local_8e0;
  ListReader local_8b0;
  ListReader local_880;
  ListReader local_850;
  ListReader local_820;
  ListReader local_7f0;
  ListReader local_7c0;
  ListReader local_790;
  ListReader local_760;
  ListReader local_730;
  ListReader local_700;
  ListReader local_6d0;
  ListReader local_6a0;
  ListReader local_670;
  ListReader local_640;
  ListReader local_610;
  ListReader local_5e0;
  ListReader local_5b0;
  ListReader local_580;
  ListReader local_550;
  ListReader local_520;
  ListReader local_4f0;
  ListReader local_4c0;
  ListReader local_490;
  ListReader local_460;
  ListReader local_430;
  ListReader local_400;
  ListReader local_3d0;
  ListReader local_3a0;
  ListReader local_370;
  ListReader local_340;
  ListReader local_310;
  ListReader local_2e0;
  ListReader local_2b0;
  ListReader local_280;
  ListReader local_250;
  ListReader local_220;
  ListReader local_1f0;
  ListReader local_1c0;
  ListReader local_190;
  ListReader local_160;
  ListReader local_130;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_a18,&local_100.super_MessageBuilder);
  local_9e8.ptr = (byte *)local_a18.data;
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_9b8,(PointerBuilder *)&local_9e8,(StructSize)0x140006);
  StructBuilder::asReader((StructBuilder *)&local_9b8);
  if (local_a18.pointerCount < 4) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 3);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_130,(PointerReader *)&local_9e8,VOID,(word *)0x0);
  local_9e8._32_6_ = local_130._32_6_;
  local_9e8.elementSize = local_130.elementSize;
  local_9e8._39_1_ = local_130._39_1_;
  local_9e8.nestingLimit = local_130.nestingLimit;
  local_9e8._44_4_ = local_130._44_4_;
  local_9e8.ptr = local_130.ptr;
  local_9e8.elementCount = local_130.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_130.step;
  local_9e8.step._2_1_ = local_130.step._2_1_;
  local_9e8.step._3_1_ = local_130.step._3_1_;
  local_9e8.segment = local_130.segment;
  local_9e8.capTable = local_130.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x18);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 5) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 4);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_160,(PointerReader *)&local_9e8,BIT,(word *)0x0);
  local_9e8._32_6_ = local_160._32_6_;
  local_9e8.elementSize = local_160.elementSize;
  local_9e8._39_1_ = local_160._39_1_;
  local_9e8.nestingLimit = local_160.nestingLimit;
  local_9e8._44_4_ = local_160._44_4_;
  local_9e8.ptr = local_160.ptr;
  local_9e8.elementCount = local_160.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_160.step;
  local_9e8.step._2_1_ = local_160.step._2_1_;
  local_9e8.step._3_1_ = local_160.step._3_1_;
  local_9e8.segment = local_160.segment;
  local_9e8.capTable = local_160.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x20);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 10) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 9);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_190,(PointerReader *)&local_9e8,BYTE,(word *)0x0);
  local_9e8._32_6_ = local_190._32_6_;
  local_9e8.elementSize = local_190.elementSize;
  local_9e8._39_1_ = local_190._39_1_;
  local_9e8.nestingLimit = local_190.nestingLimit;
  local_9e8._44_4_ = local_190._44_4_;
  local_9e8.ptr = local_190.ptr;
  local_9e8.elementCount = local_190.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_190.step;
  local_9e8.step._2_1_ = local_190.step._2_1_;
  local_9e8.step._3_1_ = local_190.step._3_1_;
  local_9e8.segment = local_190.segment;
  local_9e8.capTable = local_190.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x48);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0xb) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 10);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_1c0,(PointerReader *)&local_9e8,TWO_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_1c0._32_6_;
  local_9e8.elementSize = local_1c0.elementSize;
  local_9e8._39_1_ = local_1c0._39_1_;
  local_9e8.nestingLimit = local_1c0.nestingLimit;
  local_9e8._44_4_ = local_1c0._44_4_;
  local_9e8.ptr = local_1c0.ptr;
  local_9e8.elementCount = local_1c0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_1c0.step;
  local_9e8.step._2_1_ = local_1c0.step._2_1_;
  local_9e8.step._3_1_ = local_1c0.step._3_1_;
  local_9e8.segment = local_1c0.segment;
  local_9e8.capTable = local_1c0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x50);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0xc) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0xb);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_1f0,(PointerReader *)&local_9e8,FOUR_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_1f0._32_6_;
  local_9e8.elementSize = local_1f0.elementSize;
  local_9e8._39_1_ = local_1f0._39_1_;
  local_9e8.nestingLimit = local_1f0.nestingLimit;
  local_9e8._44_4_ = local_1f0._44_4_;
  local_9e8.ptr = local_1f0.ptr;
  local_9e8.elementCount = local_1f0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_1f0.step;
  local_9e8.step._2_1_ = local_1f0.step._2_1_;
  local_9e8.step._3_1_ = local_1f0.step._3_1_;
  local_9e8.segment = local_1f0.segment;
  local_9e8.capTable = local_1f0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x58);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0xd) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0xc);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_220,(PointerReader *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_220._32_6_;
  local_9e8.elementSize = local_220.elementSize;
  local_9e8._39_1_ = local_220._39_1_;
  local_9e8.nestingLimit = local_220.nestingLimit;
  local_9e8._44_4_ = local_220._44_4_;
  local_9e8.ptr = local_220.ptr;
  local_9e8.elementCount = local_220.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_220.step;
  local_9e8.step._2_1_ = local_220.step._2_1_;
  local_9e8.step._3_1_ = local_220.step._3_1_;
  local_9e8.segment = local_220.segment;
  local_9e8.capTable = local_220.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x60);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 6) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 5);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_250,(PointerReader *)&local_9e8,BYTE,(word *)0x0);
  local_9e8._32_6_ = local_250._32_6_;
  local_9e8.elementSize = local_250.elementSize;
  local_9e8._39_1_ = local_250._39_1_;
  local_9e8.nestingLimit = local_250.nestingLimit;
  local_9e8._44_4_ = local_250._44_4_;
  local_9e8.ptr = local_250.ptr;
  local_9e8.elementCount = local_250.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_250.step;
  local_9e8.step._2_1_ = local_250.step._2_1_;
  local_9e8.step._3_1_ = local_250.step._3_1_;
  local_9e8.segment = local_250.segment;
  local_9e8.capTable = local_250.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x28);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 7) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 6);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_280,(PointerReader *)&local_9e8,TWO_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_280._32_6_;
  local_9e8.elementSize = local_280.elementSize;
  local_9e8._39_1_ = local_280._39_1_;
  local_9e8.nestingLimit = local_280.nestingLimit;
  local_9e8._44_4_ = local_280._44_4_;
  local_9e8.ptr = local_280.ptr;
  local_9e8.elementCount = local_280.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_280.step;
  local_9e8.step._2_1_ = local_280.step._2_1_;
  local_9e8.step._3_1_ = local_280.step._3_1_;
  local_9e8.segment = local_280.segment;
  local_9e8.capTable = local_280.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x30);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 8) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 7);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_2b0,(PointerReader *)&local_9e8,FOUR_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_2b0._32_6_;
  local_9e8.elementSize = local_2b0.elementSize;
  local_9e8._39_1_ = local_2b0._39_1_;
  local_9e8.nestingLimit = local_2b0.nestingLimit;
  local_9e8._44_4_ = local_2b0._44_4_;
  local_9e8.ptr = local_2b0.ptr;
  local_9e8.elementCount = local_2b0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_2b0.step;
  local_9e8.step._2_1_ = local_2b0.step._2_1_;
  local_9e8.step._3_1_ = local_2b0.step._3_1_;
  local_9e8.segment = local_2b0.segment;
  local_9e8.capTable = local_2b0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x38);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 9) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 8);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_2e0,(PointerReader *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_2e0._32_6_;
  local_9e8.elementSize = local_2e0.elementSize;
  local_9e8._39_1_ = local_2e0._39_1_;
  local_9e8.nestingLimit = local_2e0.nestingLimit;
  local_9e8._44_4_ = local_2e0._44_4_;
  local_9e8.ptr = local_2e0.ptr;
  local_9e8.elementCount = local_2e0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_2e0.step;
  local_9e8.step._2_1_ = local_2e0.step._2_1_;
  local_9e8.step._3_1_ = local_2e0.step._3_1_;
  local_9e8.segment = local_2e0.segment;
  local_9e8.capTable = local_2e0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x40);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0xe) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0xd);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_310,(PointerReader *)&local_9e8,FOUR_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_310._32_6_;
  local_9e8.elementSize = local_310.elementSize;
  local_9e8._39_1_ = local_310._39_1_;
  local_9e8.nestingLimit = local_310.nestingLimit;
  local_9e8._44_4_ = local_310._44_4_;
  local_9e8.ptr = local_310.ptr;
  local_9e8.elementCount = local_310.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_310.step;
  local_9e8.step._2_1_ = local_310.step._2_1_;
  local_9e8.step._3_1_ = local_310.step._3_1_;
  local_9e8.segment = local_310.segment;
  local_9e8.capTable = local_310.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x68);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0xf) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0xe);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_340,(PointerReader *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  local_9e8._32_6_ = local_340._32_6_;
  local_9e8.elementSize = local_340.elementSize;
  local_9e8._39_1_ = local_340._39_1_;
  local_9e8.nestingLimit = local_340.nestingLimit;
  local_9e8._44_4_ = local_340._44_4_;
  local_9e8.ptr = local_340.ptr;
  local_9e8.elementCount = local_340.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_340.step;
  local_9e8.step._2_1_ = local_340.step._2_1_;
  local_9e8.step._3_1_ = local_340.step._3_1_;
  local_9e8.segment = local_340.segment;
  local_9e8.capTable = local_340.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x70);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0x10) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0xf);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_370,(PointerReader *)&local_9e8,POINTER,(word *)0x0);
  local_9e8._32_6_ = local_370._32_6_;
  local_9e8.elementSize = local_370.elementSize;
  local_9e8._39_1_ = local_370._39_1_;
  local_9e8.nestingLimit = local_370.nestingLimit;
  local_9e8._44_4_ = local_370._44_4_;
  local_9e8.ptr = local_370.ptr;
  local_9e8.elementCount = local_370.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_370.step;
  local_9e8.step._2_1_ = local_370.step._2_1_;
  local_9e8.step._3_1_ = local_370.step._3_1_;
  local_9e8.segment = local_370.segment;
  local_9e8.capTable = local_370.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x78);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0x11) {
    local_9e8.elementCount = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0x10);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
    local_9e8.elementCount = local_9f0;
  }
  PointerReader::getList(&local_3a0,(PointerReader *)&local_9e8,POINTER,(word *)0x0);
  local_9e8._32_6_ = local_3a0._32_6_;
  local_9e8.elementSize = local_3a0.elementSize;
  local_9e8._39_1_ = local_3a0._39_1_;
  local_9e8.nestingLimit = local_3a0.nestingLimit;
  local_9e8._44_4_ = local_3a0._44_4_;
  local_9e8.ptr = local_3a0.ptr;
  local_9e8.elementCount = local_3a0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_3a0.step;
  local_9e8.step._2_1_ = local_3a0.step._2_1_;
  local_9e8.step._3_1_ = local_3a0.step._3_1_;
  local_9e8.segment = local_3a0.segment;
  local_9e8.capTable = local_3a0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x80);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  if (local_a18.pointerCount < 0x12) {
    local_9f0 = 0x7fffffff;
    local_9e8.capTable = (CapTableReader *)0x0;
    local_9e8.ptr = (byte *)0x0;
    local_9e8.segment = (SegmentReader *)0x0;
  }
  else {
    local_9e8.ptr = (byte *)(local_a18.pointers + 0x11);
    local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
    local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  }
  local_9e8.elementCount = local_9f0;
  PointerReader::getList(&local_3d0,(PointerReader *)&local_9e8,INLINE_COMPOSITE,(word *)0x0);
  local_9e8._32_6_ = local_3d0._32_6_;
  local_9e8.elementSize = local_3d0.elementSize;
  local_9e8._39_1_ = local_3d0._39_1_;
  local_9e8.nestingLimit = local_3d0.nestingLimit;
  local_9e8._44_4_ = local_3d0._44_4_;
  local_9e8.ptr = local_3d0.ptr;
  local_9e8.elementCount = local_3d0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_3d0.step;
  local_9e8.step._2_1_ = local_3d0.step._2_1_;
  local_9e8.step._3_1_ = local_3d0.step._3_1_;
  local_9e8.segment = local_3d0.segment;
  local_9e8.capTable = local_3d0.capTable;
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x88);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x18);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x18);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,VOID,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x18);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,VOID,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x20);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x20);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BIT,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x20);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BIT,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x48);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x48);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x48);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BYTE,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x50);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x50);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x50);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,TWO_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x58);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x58);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x58);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x60);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x60);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x60);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x28);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x28);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x28);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,BYTE,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x30);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x30);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x30);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,TWO_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x38);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x38);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x38);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x40);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x40);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x40);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x68);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x68);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x68);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,FOUR_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x70);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x70);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x70);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,EIGHT_BYTES,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x78);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x78);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x78);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,POINTER,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x80);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x80);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x80);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,&local_990,POINTER,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_a1c,&local_974);
  }
  local_9e8.ptr =
       (byte *)(CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) +
               0x88);
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_990.pointer =
       (WirePointer *)
       (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x88);
  local_990.segment = local_9b8.segment;
  local_990.capTable = local_9b8.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9e8,&local_990,(StructSize)0x140006,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_a1c = 0;
    local_990.pointer =
         (WirePointer *)
         (CONCAT17(local_9b8.step._3_1_,CONCAT16(local_9b8.step._2_1_,local_9b8._24_6_)) + 0x88);
    local_990.segment = local_9b8.segment;
    local_990.capTable = local_9b8.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9e8,&local_990,(StructSize)0x140006,(word *)0x0);
    local_974 = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_a1c,&local_974);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9b8,&local_100.super_MessageBuilder);
  local_9e8.ptr = local_9b8.ptr;
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a18,(PointerBuilder *)&local_9e8,(StructSize)0x140006);
  local_9e8.ptr = (byte *)(local_a18.pointers + 3);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,VOID,(word *)0x0);
  ListBuilder::asReader(&local_400,&local_9b8);
  local_9e8._32_6_ = local_400._32_6_;
  local_9e8.elementSize = local_400.elementSize;
  local_9e8._39_1_ = local_400._39_1_;
  local_9e8.nestingLimit = local_400.nestingLimit;
  local_9e8._44_4_ = local_400._44_4_;
  local_9e8.ptr = local_400.ptr;
  local_9e8.elementCount = local_400.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_400.step;
  local_9e8.step._2_1_ = local_400.step._2_1_;
  local_9e8.step._3_1_ = local_400.step._3_1_;
  local_9e8.segment = local_400.segment;
  local_9e8.capTable = local_400.capTable;
  local_990.pointer = local_a18.pointers + 3;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 4);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,BIT,(word *)0x0);
  ListBuilder::asReader(&local_430,&local_9b8);
  local_9e8._32_6_ = local_430._32_6_;
  local_9e8.elementSize = local_430.elementSize;
  local_9e8._39_1_ = local_430._39_1_;
  local_9e8.nestingLimit = local_430.nestingLimit;
  local_9e8._44_4_ = local_430._44_4_;
  local_9e8.ptr = local_430.ptr;
  local_9e8.elementCount = local_430.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_430.step;
  local_9e8.step._2_1_ = local_430.step._2_1_;
  local_9e8.step._3_1_ = local_430.step._3_1_;
  local_9e8.segment = local_430.segment;
  local_9e8.capTable = local_430.capTable;
  local_990.pointer = local_a18.pointers + 4;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 9);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,BYTE,(word *)0x0);
  ListBuilder::asReader(&local_460,&local_9b8);
  local_9e8._32_6_ = local_460._32_6_;
  local_9e8.elementSize = local_460.elementSize;
  local_9e8._39_1_ = local_460._39_1_;
  local_9e8.nestingLimit = local_460.nestingLimit;
  local_9e8._44_4_ = local_460._44_4_;
  local_9e8.ptr = local_460.ptr;
  local_9e8.elementCount = local_460.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_460.step;
  local_9e8.step._2_1_ = local_460.step._2_1_;
  local_9e8.step._3_1_ = local_460.step._3_1_;
  local_9e8.segment = local_460.segment;
  local_9e8.capTable = local_460.capTable;
  local_990.pointer = local_a18.pointers + 9;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,TWO_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_490,&local_9b8);
  local_9e8._32_6_ = local_490._32_6_;
  local_9e8.elementSize = local_490.elementSize;
  local_9e8._39_1_ = local_490._39_1_;
  local_9e8.nestingLimit = local_490.nestingLimit;
  local_9e8._44_4_ = local_490._44_4_;
  local_9e8.ptr = local_490.ptr;
  local_9e8.elementCount = local_490.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_490.step;
  local_9e8.step._2_1_ = local_490.step._2_1_;
  local_9e8.step._3_1_ = local_490.step._3_1_;
  local_9e8.segment = local_490.segment;
  local_9e8.capTable = local_490.capTable;
  local_990.pointer = local_a18.pointers + 10;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_4c0,&local_9b8);
  local_9e8._32_6_ = local_4c0._32_6_;
  local_9e8.elementSize = local_4c0.elementSize;
  local_9e8._39_1_ = local_4c0._39_1_;
  local_9e8.nestingLimit = local_4c0.nestingLimit;
  local_9e8._44_4_ = local_4c0._44_4_;
  local_9e8.ptr = local_4c0.ptr;
  local_9e8.elementCount = local_4c0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_4c0.step;
  local_9e8.step._2_1_ = local_4c0.step._2_1_;
  local_9e8.step._3_1_ = local_4c0.step._3_1_;
  local_9e8.segment = local_4c0.segment;
  local_9e8.capTable = local_4c0.capTable;
  local_990.pointer = local_a18.pointers + 0xb;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_4f0,&local_9b8);
  local_9e8._32_6_ = local_4f0._32_6_;
  local_9e8.elementSize = local_4f0.elementSize;
  local_9e8._39_1_ = local_4f0._39_1_;
  local_9e8.nestingLimit = local_4f0.nestingLimit;
  local_9e8._44_4_ = local_4f0._44_4_;
  local_9e8.ptr = local_4f0.ptr;
  local_9e8.elementCount = local_4f0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_4f0.step;
  local_9e8.step._2_1_ = local_4f0.step._2_1_;
  local_9e8.step._3_1_ = local_4f0.step._3_1_;
  local_9e8.segment = local_4f0.segment;
  local_9e8.capTable = local_4f0.capTable;
  local_990.pointer = local_a18.pointers + 0xc;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 5);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,BYTE,(word *)0x0);
  ListBuilder::asReader(&local_520,&local_9b8);
  local_9e8._32_6_ = local_520._32_6_;
  local_9e8.elementSize = local_520.elementSize;
  local_9e8._39_1_ = local_520._39_1_;
  local_9e8.nestingLimit = local_520.nestingLimit;
  local_9e8._44_4_ = local_520._44_4_;
  local_9e8.ptr = local_520.ptr;
  local_9e8.elementCount = local_520.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_520.step;
  local_9e8.step._2_1_ = local_520.step._2_1_;
  local_9e8.step._3_1_ = local_520.step._3_1_;
  local_9e8.segment = local_520.segment;
  local_9e8.capTable = local_520.capTable;
  local_990.pointer = local_a18.pointers + 5;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 6);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,TWO_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_550,&local_9b8);
  local_9e8._32_6_ = local_550._32_6_;
  local_9e8.elementSize = local_550.elementSize;
  local_9e8._39_1_ = local_550._39_1_;
  local_9e8.nestingLimit = local_550.nestingLimit;
  local_9e8._44_4_ = local_550._44_4_;
  local_9e8.ptr = local_550.ptr;
  local_9e8.elementCount = local_550.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_550.step;
  local_9e8.step._2_1_ = local_550.step._2_1_;
  local_9e8.step._3_1_ = local_550.step._3_1_;
  local_9e8.segment = local_550.segment;
  local_9e8.capTable = local_550.capTable;
  local_990.pointer = local_a18.pointers + 6;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 7);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_580,&local_9b8);
  local_9e8._32_6_ = local_580._32_6_;
  local_9e8.elementSize = local_580.elementSize;
  local_9e8._39_1_ = local_580._39_1_;
  local_9e8.nestingLimit = local_580.nestingLimit;
  local_9e8._44_4_ = local_580._44_4_;
  local_9e8.ptr = local_580.ptr;
  local_9e8.elementCount = local_580.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_580.step;
  local_9e8.step._2_1_ = local_580.step._2_1_;
  local_9e8.step._3_1_ = local_580.step._3_1_;
  local_9e8.segment = local_580.segment;
  local_9e8.capTable = local_580.capTable;
  local_990.pointer = local_a18.pointers + 7;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 8);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_5b0,&local_9b8);
  local_9e8._32_6_ = local_5b0._32_6_;
  local_9e8.elementSize = local_5b0.elementSize;
  local_9e8._39_1_ = local_5b0._39_1_;
  local_9e8.nestingLimit = local_5b0.nestingLimit;
  local_9e8._44_4_ = local_5b0._44_4_;
  local_9e8.ptr = local_5b0.ptr;
  local_9e8.elementCount = local_5b0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_5b0.step;
  local_9e8.step._2_1_ = local_5b0.step._2_1_;
  local_9e8.step._3_1_ = local_5b0.step._3_1_;
  local_9e8.segment = local_5b0.segment;
  local_9e8.capTable = local_5b0.capTable;
  local_990.pointer = local_a18.pointers + 8;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,FOUR_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_5e0,&local_9b8);
  local_9e8._32_6_ = local_5e0._32_6_;
  local_9e8.elementSize = local_5e0.elementSize;
  local_9e8._39_1_ = local_5e0._39_1_;
  local_9e8.nestingLimit = local_5e0.nestingLimit;
  local_9e8._44_4_ = local_5e0._44_4_;
  local_9e8.ptr = local_5e0.ptr;
  local_9e8.elementCount = local_5e0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_5e0.step;
  local_9e8.step._2_1_ = local_5e0.step._2_1_;
  local_9e8.step._3_1_ = local_5e0.step._3_1_;
  local_9e8.segment = local_5e0.segment;
  local_9e8.capTable = local_5e0.capTable;
  local_990.pointer = local_a18.pointers + 0xd;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,EIGHT_BYTES,(word *)0x0);
  ListBuilder::asReader(&local_610,&local_9b8);
  local_9e8._32_6_ = local_610._32_6_;
  local_9e8.elementSize = local_610.elementSize;
  local_9e8._39_1_ = local_610._39_1_;
  local_9e8.nestingLimit = local_610.nestingLimit;
  local_9e8._44_4_ = local_610._44_4_;
  local_9e8.ptr = local_610.ptr;
  local_9e8.elementCount = local_610.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_610.step;
  local_9e8.step._2_1_ = local_610.step._2_1_;
  local_9e8.step._3_1_ = local_610.step._3_1_;
  local_9e8.segment = local_610.segment;
  local_9e8.capTable = local_610.capTable;
  local_990.pointer = local_a18.pointers + 0xe;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,POINTER,(word *)0x0);
  ListBuilder::asReader(&local_640,&local_9b8);
  local_9e8._32_6_ = local_640._32_6_;
  local_9e8.elementSize = local_640.elementSize;
  local_9e8._39_1_ = local_640._39_1_;
  local_9e8.nestingLimit = local_640.nestingLimit;
  local_9e8._44_4_ = local_640._44_4_;
  local_9e8.ptr = local_640.ptr;
  local_9e8.elementCount = local_640.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_640.step;
  local_9e8.step._2_1_ = local_640.step._2_1_;
  local_9e8.step._3_1_ = local_640.step._3_1_;
  local_9e8.segment = local_640.segment;
  local_9e8.capTable = local_640.capTable;
  local_990.pointer = local_a18.pointers + 0xf;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getList(&local_9b8,(PointerBuilder *)&local_9e8,POINTER,(word *)0x0);
  ListBuilder::asReader(&local_670,&local_9b8);
  local_9e8._32_6_ = local_670._32_6_;
  local_9e8.elementSize = local_670.elementSize;
  local_9e8._39_1_ = local_670._39_1_;
  local_9e8.nestingLimit = local_670.nestingLimit;
  local_9e8._44_4_ = local_670._44_4_;
  local_9e8.ptr = local_670.ptr;
  local_9e8.elementCount = local_670.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_670.step;
  local_9e8.step._2_1_ = local_670.step._2_1_;
  local_9e8.step._3_1_ = local_670.step._3_1_;
  local_9e8.segment = local_670.segment;
  local_9e8.capTable = local_670.capTable;
  local_990.pointer = local_a18.pointers + 0x10;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PointerBuilder::getStructList
            (&local_9b8,(PointerBuilder *)&local_9e8,(StructSize)0x140006,(word *)0x0);
  ListBuilder::asReader(&local_6a0,&local_9b8);
  local_9e8._32_6_ = local_6a0._32_6_;
  local_9e8.elementSize = local_6a0.elementSize;
  local_9e8._39_1_ = local_6a0._39_1_;
  local_9e8.nestingLimit = local_6a0.nestingLimit;
  local_9e8._44_4_ = local_6a0._44_4_;
  local_9e8.ptr = local_6a0.ptr;
  local_9e8.elementCount = local_6a0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_6a0.step;
  local_9e8.step._2_1_ = local_6a0.step._2_1_;
  local_9e8.step._3_1_ = local_6a0.step._3_1_;
  local_9e8.segment = local_6a0.segment;
  local_9e8.capTable = local_6a0.capTable;
  local_990.pointer = local_a18.pointers + 0x11;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 3);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 3);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 3);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 4);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 4);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 4);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 9);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 9);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 9);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 5);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 5);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 5);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 6);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 6);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 6);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 7);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 7);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 7);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 8);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 8);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 8);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,
               (word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_990,&local_a1c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9b8,&local_100.super_MessageBuilder);
  local_9e8.ptr = local_9b8.ptr;
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a18,(PointerBuilder *)&local_9e8,(StructSize)0x140006);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.step._2_1_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9e8.elementSize = VOID;
  local_9b8.ptr = (byte *)(local_a18.pointers + 3);
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 4);
  local_9e8.elementSize = BIT;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 9);
  local_9e8.elementSize = BYTE;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 10);
  local_9e8.elementSize = TWO_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9e8.elementSize = FOUR_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9e8.elementSize = EIGHT_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 5);
  local_9e8.elementSize = BYTE;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 6);
  local_9e8.elementSize = TWO_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 7);
  local_9e8.elementSize = FOUR_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 8);
  local_9e8.elementSize = EIGHT_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9e8.elementSize = FOUR_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9e8.elementSize = EIGHT_BYTES;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9e8.elementSize = POINTER;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9e8.elementSize = POINTER;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)0x0;
  local_9e8.elementCount = 0;
  local_9e8.step._0_2_ = 0;
  local_9e8.segment = (SegmentReader *)0x0;
  local_9e8.capTable = (CapTableReader *)0x0;
  local_9e8.step._2_1_ = 0;
  local_9e8.step._3_1_ = 0;
  local_9e8.structDataSize = 0;
  local_9e8.structPointerCount = 0;
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9e8.elementSize = INLINE_COMPOSITE;
  local_9e8.nestingLimit = 0x7fffffff;
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::setList((PointerBuilder *)&local_9b8,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 3);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 3);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 3);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 4);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 4);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 4);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 9);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 9);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 9);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 5);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 5);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 5);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 6);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 6);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 6);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 7);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 7);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 7);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 8);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 8);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 8);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,
               (word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_990,&local_a1c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_9b8,&local_100.super_MessageBuilder);
  local_9e8.ptr = local_9b8.ptr;
  local_9e8.segment = &(local_9b8.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_9b8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct(&local_a18,(PointerBuilder *)&local_9e8,(StructSize)0x140006);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.step._2_1_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = VOID;
  ListBuilder::asReader(&local_6d0,&local_9b8);
  local_9e8._32_6_ = local_6d0._32_6_;
  local_9e8.elementSize = local_6d0.elementSize;
  local_9e8._39_1_ = local_6d0._39_1_;
  local_9e8.nestingLimit = local_6d0.nestingLimit;
  local_9e8._44_4_ = local_6d0._44_4_;
  local_9e8.ptr = local_6d0.ptr;
  local_9e8.elementCount = local_6d0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_6d0.step;
  local_9e8.step._2_1_ = local_6d0.step._2_1_;
  local_9e8.step._3_1_ = local_6d0.step._3_1_;
  local_9e8.segment = local_6d0.segment;
  local_9e8.capTable = local_6d0.capTable;
  local_990.pointer = local_a18.pointers + 3;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = BIT;
  ListBuilder::asReader(&local_700,&local_9b8);
  local_9e8._32_6_ = local_700._32_6_;
  local_9e8.elementSize = local_700.elementSize;
  local_9e8._39_1_ = local_700._39_1_;
  local_9e8.nestingLimit = local_700.nestingLimit;
  local_9e8._44_4_ = local_700._44_4_;
  local_9e8.ptr = local_700.ptr;
  local_9e8.elementCount = local_700.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_700.step;
  local_9e8.step._2_1_ = local_700.step._2_1_;
  local_9e8.step._3_1_ = local_700.step._3_1_;
  local_9e8.segment = local_700.segment;
  local_9e8.capTable = local_700.capTable;
  local_990.pointer = local_a18.pointers + 4;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = BYTE;
  ListBuilder::asReader(&local_730,&local_9b8);
  local_9e8._32_6_ = local_730._32_6_;
  local_9e8.elementSize = local_730.elementSize;
  local_9e8._39_1_ = local_730._39_1_;
  local_9e8.nestingLimit = local_730.nestingLimit;
  local_9e8._44_4_ = local_730._44_4_;
  local_9e8.ptr = local_730.ptr;
  local_9e8.elementCount = local_730.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_730.step;
  local_9e8.step._2_1_ = local_730.step._2_1_;
  local_9e8.step._3_1_ = local_730.step._3_1_;
  local_9e8.segment = local_730.segment;
  local_9e8.capTable = local_730.capTable;
  local_990.pointer = local_a18.pointers + 9;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = TWO_BYTES;
  ListBuilder::asReader(&local_760,&local_9b8);
  local_9e8._32_6_ = local_760._32_6_;
  local_9e8.elementSize = local_760.elementSize;
  local_9e8._39_1_ = local_760._39_1_;
  local_9e8.nestingLimit = local_760.nestingLimit;
  local_9e8._44_4_ = local_760._44_4_;
  local_9e8.ptr = local_760.ptr;
  local_9e8.elementCount = local_760.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_760.step;
  local_9e8.step._2_1_ = local_760.step._2_1_;
  local_9e8.step._3_1_ = local_760.step._3_1_;
  local_9e8.segment = local_760.segment;
  local_9e8.capTable = local_760.capTable;
  local_990.pointer = local_a18.pointers + 10;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_790,&local_9b8);
  local_9e8._32_6_ = local_790._32_6_;
  local_9e8.elementSize = local_790.elementSize;
  local_9e8._39_1_ = local_790._39_1_;
  local_9e8.nestingLimit = local_790.nestingLimit;
  local_9e8._44_4_ = local_790._44_4_;
  local_9e8.ptr = local_790.ptr;
  local_9e8.elementCount = local_790.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_790.step;
  local_9e8.step._2_1_ = local_790.step._2_1_;
  local_9e8.step._3_1_ = local_790.step._3_1_;
  local_9e8.segment = local_790.segment;
  local_9e8.capTable = local_790.capTable;
  local_990.pointer = local_a18.pointers + 0xb;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_7c0,&local_9b8);
  local_9e8._32_6_ = local_7c0._32_6_;
  local_9e8.elementSize = local_7c0.elementSize;
  local_9e8._39_1_ = local_7c0._39_1_;
  local_9e8.nestingLimit = local_7c0.nestingLimit;
  local_9e8._44_4_ = local_7c0._44_4_;
  local_9e8.ptr = local_7c0.ptr;
  local_9e8.elementCount = local_7c0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_7c0.step;
  local_9e8.step._2_1_ = local_7c0.step._2_1_;
  local_9e8.step._3_1_ = local_7c0.step._3_1_;
  local_9e8.segment = local_7c0.segment;
  local_9e8.capTable = local_7c0.capTable;
  local_990.pointer = local_a18.pointers + 0xc;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = BYTE;
  ListBuilder::asReader(&local_7f0,&local_9b8);
  local_9e8._32_6_ = local_7f0._32_6_;
  local_9e8.elementSize = local_7f0.elementSize;
  local_9e8._39_1_ = local_7f0._39_1_;
  local_9e8.nestingLimit = local_7f0.nestingLimit;
  local_9e8._44_4_ = local_7f0._44_4_;
  local_9e8.ptr = local_7f0.ptr;
  local_9e8.elementCount = local_7f0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_7f0.step;
  local_9e8.step._2_1_ = local_7f0.step._2_1_;
  local_9e8.step._3_1_ = local_7f0.step._3_1_;
  local_9e8.segment = local_7f0.segment;
  local_9e8.capTable = local_7f0.capTable;
  local_990.pointer = local_a18.pointers + 5;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = TWO_BYTES;
  ListBuilder::asReader(&local_820,&local_9b8);
  local_9e8._32_6_ = local_820._32_6_;
  local_9e8.elementSize = local_820.elementSize;
  local_9e8._39_1_ = local_820._39_1_;
  local_9e8.nestingLimit = local_820.nestingLimit;
  local_9e8._44_4_ = local_820._44_4_;
  local_9e8.ptr = local_820.ptr;
  local_9e8.elementCount = local_820.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_820.step;
  local_9e8.step._2_1_ = local_820.step._2_1_;
  local_9e8.step._3_1_ = local_820.step._3_1_;
  local_9e8.segment = local_820.segment;
  local_9e8.capTable = local_820.capTable;
  local_990.pointer = local_a18.pointers + 6;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_850,&local_9b8);
  local_9e8._32_6_ = local_850._32_6_;
  local_9e8.elementSize = local_850.elementSize;
  local_9e8._39_1_ = local_850._39_1_;
  local_9e8.nestingLimit = local_850.nestingLimit;
  local_9e8._44_4_ = local_850._44_4_;
  local_9e8.ptr = local_850.ptr;
  local_9e8.elementCount = local_850.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_850.step;
  local_9e8.step._2_1_ = local_850.step._2_1_;
  local_9e8.step._3_1_ = local_850.step._3_1_;
  local_9e8.segment = local_850.segment;
  local_9e8.capTable = local_850.capTable;
  local_990.pointer = local_a18.pointers + 7;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_880,&local_9b8);
  local_9e8._32_6_ = local_880._32_6_;
  local_9e8.elementSize = local_880.elementSize;
  local_9e8._39_1_ = local_880._39_1_;
  local_9e8.nestingLimit = local_880.nestingLimit;
  local_9e8._44_4_ = local_880._44_4_;
  local_9e8.ptr = local_880.ptr;
  local_9e8.elementCount = local_880.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_880.step;
  local_9e8.step._2_1_ = local_880.step._2_1_;
  local_9e8.step._3_1_ = local_880.step._3_1_;
  local_9e8.segment = local_880.segment;
  local_9e8.capTable = local_880.capTable;
  local_990.pointer = local_a18.pointers + 8;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = FOUR_BYTES;
  ListBuilder::asReader(&local_8b0,&local_9b8);
  local_9e8._32_6_ = local_8b0._32_6_;
  local_9e8.elementSize = local_8b0.elementSize;
  local_9e8._39_1_ = local_8b0._39_1_;
  local_9e8.nestingLimit = local_8b0.nestingLimit;
  local_9e8._44_4_ = local_8b0._44_4_;
  local_9e8.ptr = local_8b0.ptr;
  local_9e8.elementCount = local_8b0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_8b0.step;
  local_9e8.step._2_1_ = local_8b0.step._2_1_;
  local_9e8.step._3_1_ = local_8b0.step._3_1_;
  local_9e8.segment = local_8b0.segment;
  local_9e8.capTable = local_8b0.capTable;
  local_990.pointer = local_a18.pointers + 0xd;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = EIGHT_BYTES;
  ListBuilder::asReader(&local_8e0,&local_9b8);
  local_9e8._32_6_ = local_8e0._32_6_;
  local_9e8.elementSize = local_8e0.elementSize;
  local_9e8._39_1_ = local_8e0._39_1_;
  local_9e8.nestingLimit = local_8e0.nestingLimit;
  local_9e8._44_4_ = local_8e0._44_4_;
  local_9e8.ptr = local_8e0.ptr;
  local_9e8.elementCount = local_8e0.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_8e0.step;
  local_9e8.step._2_1_ = local_8e0.step._2_1_;
  local_9e8.step._3_1_ = local_8e0.step._3_1_;
  local_9e8.segment = local_8e0.segment;
  local_9e8.capTable = local_8e0.capTable;
  local_990.pointer = local_a18.pointers + 0xe;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = POINTER;
  ListBuilder::asReader(&local_910,&local_9b8);
  local_9e8._32_6_ = local_910._32_6_;
  local_9e8.elementSize = local_910.elementSize;
  local_9e8._39_1_ = local_910._39_1_;
  local_9e8.nestingLimit = local_910.nestingLimit;
  local_9e8._44_4_ = local_910._44_4_;
  local_9e8.ptr = local_910.ptr;
  local_9e8.elementCount = local_910.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_910.step;
  local_9e8.step._2_1_ = local_910.step._2_1_;
  local_9e8.step._3_1_ = local_910.step._3_1_;
  local_9e8.segment = local_910.segment;
  local_9e8.capTable = local_910.capTable;
  local_990.pointer = local_a18.pointers + 0xf;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = POINTER;
  ListBuilder::asReader(&local_940,&local_9b8);
  local_9e8._32_6_ = local_940._32_6_;
  local_9e8.elementSize = local_940.elementSize;
  local_9e8._39_1_ = local_940._39_1_;
  local_9e8.nestingLimit = local_940.nestingLimit;
  local_9e8._44_4_ = local_940._44_4_;
  local_9e8.ptr = local_940.ptr;
  local_9e8.elementCount = local_940.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_940.step;
  local_9e8.step._2_1_ = local_940.step._2_1_;
  local_9e8.step._3_1_ = local_940.step._3_1_;
  local_9e8.segment = local_940.segment;
  local_9e8.capTable = local_940.capTable;
  local_990.pointer = local_a18.pointers + 0x10;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9b8.ptr = (byte *)0x0;
  local_9b8._24_6_ = 0;
  local_9b8.segment = (SegmentBuilder *)0x0;
  local_9b8.capTable = (CapTableBuilder *)0x0;
  local_9b8.step._2_1_ = 0;
  local_9b8.step._3_1_ = 0;
  local_9b8.structDataSize = 0;
  local_9b8.structPointerCount = 0;
  local_9b8.elementSize = INLINE_COMPOSITE;
  ListBuilder::asReader(&local_970,&local_9b8);
  local_9e8._32_6_ = local_970._32_6_;
  local_9e8.elementSize = local_970.elementSize;
  local_9e8._39_1_ = local_970._39_1_;
  local_9e8.nestingLimit = local_970.nestingLimit;
  local_9e8._44_4_ = local_970._44_4_;
  local_9e8.ptr = local_970.ptr;
  local_9e8.elementCount = local_970.elementCount;
  local_9e8.step._0_2_ = (undefined2)local_970.step;
  local_9e8.step._2_1_ = local_970.step._2_1_;
  local_9e8.step._3_1_ = local_970.step._3_1_;
  local_9e8.segment = local_970.segment;
  local_9e8.capTable = local_970.capTable;
  local_990.pointer = local_a18.pointers + 0x11;
  local_990.segment = local_a18.segment;
  local_990.capTable = local_a18.capTable;
  PointerBuilder::setList(&local_990,&local_9e8,false);
  local_9e8.ptr = (byte *)(local_a18.pointers + 3);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 3);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 3);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,VOID,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 4);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 4);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 4);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BIT,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 9);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 9);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 9);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xb);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xc);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 5);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 5);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 5);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,BYTE,(word *)0x0)
    ;
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 6);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 6);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 6);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,TWO_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 7);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 7);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 7);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 8);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 8);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 8);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xd);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,FOUR_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xe);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,EIGHT_BYTES,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0xf);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x10);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,POINTER,(word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_990,&local_a1c);
  }
  local_9e8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9e8.segment = &(local_a18.segment)->super_SegmentReader;
  local_9e8.capTable = &(local_a18.capTable)->super_CapTableReader;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_9e8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
  local_9b8.segment = local_a18.segment;
  local_9b8.capTable = local_a18.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,(word *)0x0
            );
  if ((local_9e8.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_990.segment = (SegmentBuilder *)((ulong)local_990.segment & 0xffffffff00000000);
    local_9b8.ptr = (byte *)(local_a18.pointers + 0x11);
    local_9b8.segment = local_a18.segment;
    local_9b8.capTable = local_a18.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_9e8,(PointerBuilder *)&local_9b8,(StructSize)0x140006,
               (word *)0x0);
    local_a1c = local_9e8.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_990,&local_a1c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, SetListToEmpty) {
  // Test initializing list fields from various ways of constructing zero-sized lists.
  // At one point this would often fail because the lists would have ElementSize::VOID which is
  // incompatible with other list sizes.

#define ALL_LIST_TYPES(MACRO) \
  MACRO(Void, Void) \
  MACRO(Bool, bool) \
  MACRO(UInt8, uint8_t) \
  MACRO(UInt16, uint16_t) \
  MACRO(UInt32, uint32_t) \
  MACRO(UInt64, uint64_t) \
  MACRO(Int8, int8_t) \
  MACRO(Int16, int16_t) \
  MACRO(Int32, int32_t) \
  MACRO(Int64, int64_t) \
  MACRO(Float32, float) \
  MACRO(Float64, double) \
  MACRO(Text, Text) \
  MACRO(Data, Data) \
  MACRO(Struct, TestAllTypes)

#define SET_FROM_READER_ACCESSOR(name, type) \
  root.set##name##List(reader.get##name##List());

#define SET_FROM_BUILDER_ACCESSOR(name, type) \
  root.set##name##List(root.get##name##List());

#define SET_FROM_READER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Reader());

#define SET_FROM_BUILDER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Builder());

#define CHECK_EMPTY_NONNULL(name, type) \
  EXPECT_TRUE(root.has##name##List()); \
  EXPECT_EQ(0, root.get##name##List().size());

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    auto reader = root.asReader();
    ALL_LIST_TYPES(SET_FROM_READER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_READER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

#undef SET_FROM_READER_ACCESSOR
#undef SET_FROM_BUILDER_ACCESSOR
#undef SET_FROM_READER_CONSTRUCTOR
#undef SET_FROM_BUILDER_CONSTRUCTOR
#undef CHECK_EMPTY_NONNULL
}